

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

bool TestConstExpr::NotEqualTest<int,long>(void)

{
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs;
  bool bVar1;
  uint in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffffd0;
  undefined1 lhs;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffffd4;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_00;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffffd8;
  undefined4 uVar2;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffffe4;
  int local_18;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_14;
  int local_10;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_c;
  int local_8;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_4;
  
  local_8 = 3;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            (&local_4,&local_8);
  bVar1 = ::operator!=(CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       in_stack_ffffffffffffffd4);
  in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8 & 0xffffff;
  if (bVar1) {
    local_10 = 4;
    SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (&local_c,&local_10);
    bVar1 = ::operator!=(in_stack_ffffffffffffffd4,
                         CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8 & 0xffffff;
    if (bVar1) {
      local_18 = 6;
      SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
                (&local_14,&local_18);
      uVar2 = 7;
      SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
      SafeInt<int>((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                    *)CONCAT44(in_stack_ffffffffffffffd4.m_int,in_stack_ffffffffffffffd0.m_int),
                   (int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      lhs = (undefined1)((uint)in_stack_ffffffffffffffd0.m_int >> 0x18);
      rhs.m_int._4_4_ = uVar2;
      rhs.m_int._0_4_ = in_stack_ffffffffffffffd8.m_int;
      bVar1 = ::operator!=(in_stack_ffffffffffffffe4,rhs);
      in_stack_ffffffffffffffc8 = 0;
      if (bVar1) {
        rhs_00.m_int = 1;
        SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
        SafeInt((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                 *)&stack0xffffffffffffffd8,(int *)&stack0xffffffffffffffd4);
        bVar1 = ::operator!=((bool)lhs,rhs_00);
        in_stack_ffffffffffffffc8 = 0;
        if (bVar1) {
          SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
          SafeInt((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                   *)&stack0xffffffffffffffd0,(int *)&stack0xffffffffffffffcc);
          bVar1 = ::operator!=((bool)lhs,rhs_00);
          in_stack_ffffffffffffffc8 = (uint)bVar1 << 0x18;
        }
      }
    }
  }
  return SUB41(in_stack_ffffffffffffffc8 >> 0x18,0);
}

Assistant:

SAFEINT_CONSTEXPR11 bool NotEqualTest()
	{
		return
			(U)2 != SafeInt<T>(3) &&
			SafeInt<T>(4) != (U)5 &&
			SafeInt<T>(6) != SafeInt<U>(7) &&
			true != SafeInt<T>(1) &&
			false != SafeInt<T>(0);
	}